

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_timestamp(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int32_t increment;
  int32_t timestamp;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,0x10,100,1000,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,0x10,&timestamp,&increment,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_TIMESTAMP (timestamp, increment))";
    uVar2 = 0xfc;
  }
  else if (timestamp == 100) {
    if (increment == 1000) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "increment == 1000";
    uVar2 = 0xff;
  }
  else {
    pcVar4 = "timestamp == 100";
    uVar2 = 0xfe;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_timestamp",pcVar4);
  abort();
}

Assistant:

static void
test_timestamp (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_timestamp (&expected, "foo", -1, 100, 1000);

   BCON_APPEND (&bcon, "foo", BCON_TIMESTAMP (100, 1000));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}